

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.c
# Opt level: O0

void Curl_move_handle_from_send_to_recv_pipe(SessionHandle *handle,connectdata *conn)

{
  curl_llist_element *local_20;
  curl_llist_element *curr;
  connectdata *conn_local;
  SessionHandle *handle_local;
  
  local_20 = conn->send_pipe->head;
  while( true ) {
    if (local_20 == (curl_llist_element *)0x0) {
      return;
    }
    if ((SessionHandle *)local_20->ptr == handle) break;
    local_20 = local_20->next;
  }
  Curl_llist_move(conn->send_pipe,local_20,conn->recv_pipe,conn->recv_pipe->tail);
  if (conn->send_pipe->head == (curl_llist_element *)0x0) {
    return;
  }
  Curl_pipeline_leave_write(conn);
  Curl_expire((SessionHandle *)conn->send_pipe->head->ptr,1);
  return;
}

Assistant:

void Curl_move_handle_from_send_to_recv_pipe(struct SessionHandle *handle,
                                             struct connectdata *conn)
{
  struct curl_llist_element *curr;

  curr = conn->send_pipe->head;
  while(curr) {
    if(curr->ptr == handle) {
      Curl_llist_move(conn->send_pipe, curr,
                      conn->recv_pipe, conn->recv_pipe->tail);

      if(conn->send_pipe->head) {
        /* Since there's a new easy handle at the start of the send pipeline,
           set its timeout value to 1ms to make it trigger instantly */
        Curl_pipeline_leave_write(conn); /* not used now */
#ifdef DEBUGBUILD
        infof(conn->data, "%p is at send pipe head B!\n",
              (void *)conn->send_pipe->head->ptr);
#endif
        Curl_expire(conn->send_pipe->head->ptr, 1);
      }

      /* The receiver's list is not really interesting here since either this
         handle is now first in the list and we'll deal with it soon, or
         another handle is already first and thus is already taken care of */

      break; /* we're done! */
    }
    curr = curr->next;
  }
}